

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O0

int test_map2json_primitive(void)

{
  int iVar1;
  char *pcVar2;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char primitiveMethod [12];
  map2json_t *map2jsonObj;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  map2json_init((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  map2json_push((map2json_t *)primitiveMethod._4_8_,in_stack_00000008,unaff_retaddr);
  pcVar2 = map2json_create((map2json_t *)0x1027cd);
  printf("Expected: \t%s\nActual: \t%s\n\n","{\"fakePrimitive\":function()}",pcVar2);
  pcVar2 = map2json_create((map2json_t *)0x1027ef);
  iVar1 = strcmp("{\"fakePrimitive\":function()}",pcVar2);
  if (iVar1 == 0) {
    map2json_destroy((map2json_t *)0x102817);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int test_map2json_primitive() {
	map2json_t *map2jsonObj = map2json_init(NULL);

	char primitiveMethod[] = " function()";
	*primitiveMethod = JSON2MAP_PRIMITIVE_PREFIXER;
	map2json_push(map2jsonObj, "fakePrimitive", primitiveMethod);

	ASSERTSTR("{\"fakePrimitive\":function()}", map2json_create(map2jsonObj));
	map2json_destroy(map2jsonObj);
	return 0;
}